

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

void __thiscall
math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
eval_divide_by_single_limb
          (uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          limb_type short_denominator,unsigned_fast_type u_offset,
          uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *remainder)

{
  pointer pvVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined8 uVar4;
  pointer pvVar5;
  long lVar6;
  ulong uVar7;
  
  if (u_offset << 0x20 == 0x20000000000) {
    uVar7 = 0;
    iVar3 = 0;
  }
  else {
    pvVar1 = (this->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    lVar6 = (long)(0x20000000000 - (u_offset << 0x20)) >> 0x1e;
    uVar4 = 0;
    uVar7 = 0;
    do {
      uVar7 = CONCAT44((int)uVar7 - (int)uVar4 * short_denominator,
                       *(undefined4 *)((long)pvVar1 + lVar6 + -4));
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar7;
      uVar4 = SUB168(auVar2 / ZEXT416(short_denominator),0);
      iVar3 = SUB164(auVar2 / ZEXT416(short_denominator),0);
      *(int *)((long)pvVar1 + lVar6 + -4) = iVar3;
      lVar6 = lVar6 + -4;
    } while (lVar6 != 0);
  }
  if (remainder != (uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)0x0) {
    pvVar5 = (pointer)operator_new(0x800);
    memset(pvVar5 + 1,0,0x7fc);
    *pvVar5 = (int)uVar7 - iVar3 * short_denominator;
    uVar7 = (ulong)(remainder->values).
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elem_count;
    (remainder->values).
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
         0x200;
    pvVar1 = (remainder->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    (remainder->values).
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
         pvVar5;
    if (uVar7 != 0) {
      operator_delete(pvVar1,uVar7 << 2);
      return;
    }
  }
  return;
}

Assistant:

constexpr auto eval_divide_by_single_limb(const limb_type          short_denominator,
                                              const unsigned_fast_type u_offset,
                                                    uintwide_t*        remainder) -> void
    {
      // The denominator has one single limb.
      // Use a one-dimensional division algorithm.

      auto long_numerator = double_limb_type { };
      auto hi_part        = static_cast<limb_type>(UINT8_C(0));

      {
        reverse_iterator
          ri
          {
            detail::advance_and_point
            (
              values.begin(),
              static_cast<size_t>(number_of_limbs - static_cast<size_t>(u_offset))
            )
          };

        for( ; ri != values.rend(); ++ri) // NOLINT(altera-id-dependent-backward-branch)
        {
          long_numerator =
            static_cast<double_limb_type>
            (
               *ri
             + static_cast<double_limb_type>
               (
                    static_cast<double_limb_type>
                    (
                        long_numerator
                      - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                    )
                 << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
               )
            );

          *ri = detail::make_lo<limb_type>(static_cast<double_limb_type>(long_numerator / short_denominator));

          hi_part = *ri;
        }
      }

      if(remainder != nullptr)
      {
        long_numerator =
          static_cast<double_limb_type>
          (
             static_cast<double_limb_type>(*values.cbegin())
           + static_cast<double_limb_type>
             (
                  static_cast<double_limb_type>
                  (
                    long_numerator - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                  )
               << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
             )
          );

        *remainder =
          static_cast<limb_type>
          (
            long_numerator >> static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
          );
      }
    }